

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test::
~DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test
          (DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test *this)

{
  void *in_RDI;
  
  ~DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test
            ((DatarateTestSVC_BasicRateTargetingFixedModeSVC3TL3SLHD_Test *)0x7e63e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingFixedModeSVC3TL3SLHD) {
  BasicRateTargetingFixedModeSVC3TL3SLHDTest();
}